

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<unsigned_short,_double>::Run
          (DataTransform<unsigned_short,_double> *this,istream *input_stream)

{
  ulong uVar1;
  istream *in_RSI;
  long in_RDI;
  bool bVar2;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  string *program_name;
  ostringstream error_message;
  bool is_clipped;
  double output_data;
  invalid_argument *anon_var_0;
  string word;
  unsigned_short input_data;
  int index;
  char buffer [128];
  size_t *in_stack_fffffffffffffd28;
  allocator *in_stack_fffffffffffffd30;
  ostringstream *in_stack_fffffffffffffd38;
  ostream *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  allocator local_281;
  string local_280 [32];
  ostringstream local_260 [376];
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar3;
  int local_d0;
  string local_c0 [34];
  ushort local_9e;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar2 = sptk::ReadStream<unsigned_short>
                        ((unsigned_short *)in_stack_fffffffffffffd38,
                         (istream *)in_stack_fffffffffffffd30);
      if (!bVar2) goto LAB_001551fd;
    }
    else {
      std::__cxx11::string::string(local_c0);
      std::operator>>(local_18,local_c0);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd4c = SUB104(in_ST0,0);
        local_9e = (ushort)(int)ROUND(in_ST0);
        local_d0 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      else {
        local_d0 = 2;
      }
      std::__cxx11::string::~string(local_c0);
      if (local_d0 != 0) {
        if (local_d0 != 1) {
LAB_001551fd:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_00155239;
      }
      in_stack_fffffffffffffd48 = 0;
    }
    program_name = (string *)(double)local_9e;
    uVar3 = false;
    if (*(double *)(in_RDI + 0x38) < *(double *)(in_RDI + 0x40)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)(ulong)local_9e < (long)*(double *)(in_RDI + 0x38)) {
          program_name = *(string **)(in_RDI + 0x38);
          uVar3 = true;
        }
        else {
          uVar3 = (long)*(double *)(in_RDI + 0x40) < (long)(ulong)local_9e;
          if ((bool)uVar3) {
            program_name = *(string **)(in_RDI + 0x40);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        uVar1 = (ulong)*(double *)(in_RDI + 0x38);
        if ((ulong)local_9e <
            (uVar1 | (long)(*(double *)(in_RDI + 0x38) - 9.223372036854776e+18) &
                     (long)uVar1 >> 0x3f)) {
          program_name = *(string **)(in_RDI + 0x38);
          uVar3 = true;
        }
        else {
          uVar1 = (ulong)*(double *)(in_RDI + 0x40);
          uVar3 = (uVar1 | (long)(*(double *)(in_RDI + 0x40) - 9.223372036854776e+18) &
                           (long)uVar1 >> 0x3f) < (ulong)local_9e;
          if ((bool)uVar3) {
            program_name = *(string **)(in_RDI + 0x40);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        in_ST6 = in_ST5;
        in_ST7 = in_ST5;
        if (*(double *)(in_RDI + 0x38) <= (double)local_9e) {
          uVar3 = *(double *)(in_RDI + 0x40) < (double)local_9e;
          if ((bool)uVar3) {
            program_name = *(string **)(in_RDI + 0x40);
          }
        }
        else {
          program_name = *(string **)(in_RDI + 0x38);
          uVar3 = true;
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && ((bool)uVar3 == false)) {
      if ((double)local_9e <= 0.0) {
        program_name = (string *)((double)local_9e - 0.5);
      }
      else {
        program_name = (string *)((double)local_9e + 0.5);
      }
    }
    if (((bool)uVar3 != false) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffd38 = local_260;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd40 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd38,local_9c);
      std::operator<<(in_stack_fffffffffffffd40,"th data is over the range of output type");
      in_stack_fffffffffffffd30 = &local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"x2x",in_stack_fffffffffffffd30);
      sptk::PrintErrorMessage
                (program_name,(ostringstream *)CONCAT17(uVar3,in_stack_ffffffffffffff18));
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      bVar2 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar2) {
        local_1 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_260);
      if (bVar2) goto LAB_00155239;
    }
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar2 = sptk::WriteStream<double>((double)in_stack_fffffffffffffd28,(ostream *)0x1551d5);
      if (!bVar2) {
        local_1 = 0;
LAB_00155239:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar2 = sptk::SnPrintf<double>
                        ((double)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                         (string *)in_stack_fffffffffffffd40,(size_t)in_stack_fffffffffffffd38,
                         (char *)in_stack_fffffffffffffd30);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_00155239;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }